

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O2

int demoAccess(unqlite_vfs *pVfs,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  int __type;
  stat buf;
  
  if ((uint)flags < 3) {
    iVar1 = 6;
    if (flags != 1) {
      iVar1 = 0;
    }
    __type = 4;
    if (flags != 2) {
      __type = iVar1;
    }
    iVar1 = access(zPath,__type);
    *pResOut = (uint)(iVar1 == 0);
    if (iVar1 == 0 && flags == 0) {
      iVar1 = stat(zPath,(stat *)&buf);
      if ((iVar1 == 0) && (buf.st_size == 0)) {
        *pResOut = 0;
      }
    }
    return 0;
  }
  __assert_fail("flags==UNQLITE_ACCESS_EXISTS || flags==UNQLITE_ACCESS_READ || flags==UNQLITE_ACCESS_READWRITE"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/symisc[P]unqlite/example/demovfs/unqlite_demovfs.c"
                ,0x229,"int demoAccess(unqlite_vfs *, const char *, int, int *)");
}

Assistant:

static int demoAccess(
  unqlite_vfs *pVfs, 
  const char *zPath, 
  int flags, 
  int *pResOut
){
#if !defined(_MSC_VER) && !defined(__MINGW32__)
  int rc;                         /* access() return code */
#endif  /* !defined(_MSC_VER) && !defined(__MINGW32__) */
  int eAccess = F_OK;             /* Second argument to access() */

  assert( flags==UNQLITE_ACCESS_EXISTS       /* access(zPath, F_OK) */
       || flags==UNQLITE_ACCESS_READ         /* access(zPath, R_OK) */
       || flags==UNQLITE_ACCESS_READWRITE    /* access(zPath, R_OK|W_OK) */
  );

  if( flags==UNQLITE_ACCESS_READWRITE ) eAccess = R_OK|W_OK;
  if( flags==UNQLITE_ACCESS_READ )      eAccess = R_OK;

  /* we could do just  this */
  //  rc = access(zPath, eAccess);
  //  *pResOut = (rc==0);
  
  /* taken from unqlite unixAccess function */
  *pResOut = (access(zPath, eAccess)==0);
  if( flags==UNQLITE_ACCESS_EXISTS && *pResOut ){
    struct stat buf;
    if( 0==stat(zPath, &buf) && buf.st_size==0 ){
      *pResOut = 0;
    }
  }
  return UNQLITE_OK;

}